

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O3

int jpc_dec_process_sot(jpc_dec_t *dec,jpc_ms_t *ms)

{
  jpc_dec_tile_t *pjVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  jpc_ppxstab_t *pjVar6;
  jpc_pocpchg_t *pjVar7;
  uint_fast16_t uVar8;
  jpc_dec_cp_t *pjVar9;
  jpc_dec_ccp_t *pjVar10;
  uint_fast32_t uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  jas_image_cmptparm_t *cmptparms;
  _Bool *p_Var15;
  jas_image_t *pjVar16;
  jpc_streamlist_t *streamlist;
  jas_stream_t **ppjVar17;
  jas_stream_t *stream;
  jpc_dec_cp_t *ptr;
  jpc_pchglist_t *pjVar18;
  jpc_dec_ccp_t *pjVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  jas_image_cmptparm_t *pjVar23;
  ulong uVar24;
  uint *buf;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  int iVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar31 [16];
  
  if (dec->state == 4) {
    cmptparms = (jas_image_cmptparm_t *)jas_alloc2((long)dec->numcomps,0x38);
    if (cmptparms == (jas_image_cmptparm_t *)0x0) {
      return -1;
    }
    uVar26 = dec->numcomps;
    if (0 < (int)uVar26) {
      p_Var15 = &dec->cmpts->sgnd;
      pjVar23 = cmptparms;
      uVar20 = uVar26;
      do {
        pjVar23->tlx = 0;
        pjVar23->tly = 0;
        pjVar23->prec = (int)*(uint_fast16_t *)(p_Var15 + -8);
        pjVar23->sgnd = (uint)*p_Var15;
        uVar11 = *(uint_fast32_t *)(p_Var15 + -0x10);
        pjVar23->width = *(uint_fast32_t *)(p_Var15 + -0x18);
        pjVar23->height = uVar11;
        uVar11 = *(uint_fast32_t *)(p_Var15 + -0x20);
        pjVar23->hstep = ((jpc_dec_cmpt_t *)(p_Var15 + -0x28))->hstep;
        pjVar23->vstep = uVar11;
        pjVar23 = pjVar23 + 1;
        p_Var15 = p_Var15 + 0x40;
        uVar20 = uVar20 - 1;
      } while (uVar20 != 0);
    }
    pjVar16 = jas_image_create(uVar26,cmptparms,0x4000);
    dec->image = pjVar16;
    jas_free(cmptparms);
    if (pjVar16 == (jas_image_t *)0x0) {
      return -1;
    }
    pjVar6 = dec->ppmstab;
    if (pjVar6 != (jpc_ppxstab_t *)0x0) {
      streamlist = (jpc_streamlist_t *)jas_malloc(0x10);
      if (streamlist == (jpc_streamlist_t *)0x0) {
LAB_0011bc2e:
        dec->pkthdrstreams = (jpc_streamlist_t *)0x0;
        return -1;
      }
      streamlist->numstreams = 0;
      streamlist->maxstreams = 100;
      ppjVar17 = (jas_stream_t **)jas_alloc2(100,8);
      streamlist->streams = ppjVar17;
      if (ppjVar17 == (jas_stream_t **)0x0) {
        jas_free(streamlist);
        goto LAB_0011bc2e;
      }
      iVar21 = streamlist->maxstreams;
      if (0 < (long)iVar21) {
        lVar22 = 0;
        do {
          streamlist->streams[lVar22] = (jas_stream_t *)0x0;
          lVar22 = lVar22 + 1;
        } while (iVar21 != lVar22);
      }
      if (pjVar6->numents != 0) {
        uVar24 = (*pjVar6->ents)->len;
        if (3 < uVar24) {
          buf = (uint *)(*pjVar6->ents)->data;
          iVar21 = 0;
          do {
            stream = jas_stream_memopen((char *)0x0,0);
            if (stream == (jas_stream_t *)0x0) break;
            iVar29 = streamlist->numstreams;
            iVar32 = streamlist->maxstreams;
            ppjVar17 = streamlist->streams;
            if (iVar32 <= iVar29) {
              ppjVar17 = (jas_stream_t **)jas_realloc2(ppjVar17,(long)iVar32 + 0x800,8);
              if (ppjVar17 == (jas_stream_t **)0x0) break;
              iVar4 = streamlist->numstreams;
              lVar22 = (long)iVar4;
              iVar5 = streamlist->maxstreams;
              if (iVar4 < iVar5) {
                do {
                  streamlist->streams[lVar22] = (jas_stream_t *)0x0;
                  lVar22 = lVar22 + 1;
                } while (iVar5 != lVar22);
              }
              streamlist->maxstreams = iVar32 + 0x400;
              streamlist->streams = ppjVar17;
              if (iVar4 != iVar29) break;
            }
            ppjVar17[iVar29] = stream;
            streamlist->numstreams = iVar29 + 1;
            uVar26 = *buf;
            uVar26 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                     uVar26 << 0x18;
            uVar27 = (ulong)uVar26;
            uVar24 = uVar24 - 4;
            buf = buf + 1;
            if (uVar26 != 0) {
              do {
                if (uVar24 == 0) {
                  iVar21 = iVar21 + 1;
                  if (pjVar6->numents <= iVar21) goto LAB_0011bc15;
                  uVar24 = pjVar6->ents[iVar21]->len;
                  buf = (uint *)pjVar6->ents[iVar21]->data;
                }
                uVar25 = uVar24;
                if (uVar27 < uVar24) {
                  uVar25 = uVar27;
                }
                uVar20 = (uint)uVar25;
                uVar26 = jas_stream_write(stream,buf,uVar20);
                if (uVar26 != uVar20) goto LAB_0011bc15;
                lVar22 = (long)(int)uVar20;
                buf = (uint *)((long)buf + lVar22);
                uVar24 = uVar24 - lVar22;
                uVar27 = uVar27 - lVar22;
              } while (uVar27 != 0);
            }
            jas_stream_rewind(stream);
            if (uVar24 == 0) {
              iVar21 = iVar21 + 1;
              if (pjVar6->numents <= iVar21) goto LAB_0011bda7;
              uVar24 = pjVar6->ents[iVar21]->len;
              buf = (uint *)pjVar6->ents[iVar21]->data;
            }
          } while (3 < uVar24);
        }
LAB_0011bc15:
        jpc_streamlist_destroy(streamlist);
        goto LAB_0011bc2e;
      }
LAB_0011bda7:
      dec->pkthdrstreams = streamlist;
      jpc_ppxstab_destroy(dec->ppmstab);
      dec->ppmstab = (jpc_ppxstab_t *)0x0;
    }
  }
  pjVar7 = (ms->parms).poc.pchgs;
  if (pjVar7 == (jpc_pocpchg_t *)0x0) {
    lVar22 = 0;
  }
  else {
    lVar22 = (long)pjVar7 + (dec->in->rwcnt_ - ms->len) + -4;
  }
  dec->curtileendoff = lVar22;
  uVar8 = (ms->parms).sot.tileno;
  if (dec->numtiles <= (int)uVar8) {
    jas_eprintf("invalid tile number in SOT marker segment\n");
    return -1;
  }
  pjVar1 = dec->tiles + uVar8;
  dec->curtile = pjVar1;
  bVar2 = (ms->parms).sot.partno;
  iVar21 = -1;
  if (dec->tiles[uVar8].partno != (uint)bVar2) {
    return -1;
  }
  iVar29 = pjVar1->numparts;
  if (0 < iVar29 && iVar29 <= (int)(uint)bVar2) {
    return -1;
  }
  if ((iVar29 == 0) && (bVar3 = (ms->parms).sot.numparts, bVar3 != 0)) {
    pjVar1->numparts = (uint)bVar3;
  }
  pjVar1->pptstab = (jpc_ppxstab_t *)0x0;
  if (pjVar1->state == 0) {
    pjVar1->state = 1;
    if (pjVar1->cp != (jpc_dec_cp_t *)0x0) {
      __assert_fail("!tile->cp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                    ,0x22c,"int jpc_dec_process_sot(jpc_dec_t *, jpc_ms_t *)");
    }
    pjVar9 = dec->cp;
    ptr = jpc_dec_cp_create((long)pjVar9->numcomps);
    if (ptr != (jpc_dec_cp_t *)0x0) {
      ptr->flags = pjVar9->flags;
      ptr->prgord = pjVar9->prgord;
      ptr->numlyrs = pjVar9->numlyrs;
      ptr->mctid = pjVar9->mctid;
      ptr->csty = pjVar9->csty;
      jpc_pchglist_destroy(ptr->pchglist);
      ptr->pchglist = (jpc_pchglist_t *)0x0;
      pjVar18 = jpc_pchglist_copy(pjVar9->pchglist);
      ptr->pchglist = pjVar18;
      if (pjVar18 != (jpc_pchglist_t *)0x0) {
        if (0 < pjVar9->numcomps) {
          pjVar19 = pjVar9->ccps;
          pjVar10 = ptr->ccps;
          lVar22 = 0;
          iVar21 = 0;
          do {
            memcpy((void *)((long)pjVar10->stepsizes + lVar22 + -0x18),
                   (void *)((long)pjVar19->stepsizes + lVar22 + -0x18),0x380);
            iVar21 = iVar21 + 1;
            lVar22 = lVar22 + 0x380;
          } while (iVar21 < pjVar9->numcomps);
        }
        pjVar1->cp = ptr;
        pjVar9 = dec->cp;
        pjVar9->flags = pjVar9->flags & 3;
        auVar14 = _DAT_0013c1d0;
        auVar13 = _DAT_00139d70;
        auVar12 = _DAT_001384e0;
        iVar21 = pjVar9->numcomps;
        if (0 < (long)iVar21) {
          pjVar19 = pjVar9->ccps;
          lVar22 = (long)iVar21 + -1;
          auVar28._8_4_ = (int)lVar22;
          auVar28._0_8_ = lVar22;
          auVar28._12_4_ = (int)((ulong)lVar22 >> 0x20);
          uVar24 = 0;
          auVar28 = auVar28 ^ _DAT_001384e0;
          do {
            auVar30._8_4_ = (int)uVar24;
            auVar30._0_8_ = uVar24;
            auVar30._12_4_ = (int)(uVar24 >> 0x20);
            auVar31 = (auVar30 | auVar13) ^ auVar12;
            iVar29 = auVar28._4_4_;
            if ((bool)(~(auVar31._4_4_ == iVar29 && auVar28._0_4_ < auVar31._0_4_ ||
                        iVar29 < auVar31._4_4_) & 1)) {
              pjVar19->flags = 0;
            }
            if ((auVar31._12_4_ != auVar28._12_4_ || auVar31._8_4_ <= auVar28._8_4_) &&
                auVar31._12_4_ <= auVar28._12_4_) {
              pjVar19[1].flags = 0;
            }
            auVar30 = (auVar30 | auVar14) ^ auVar12;
            iVar32 = auVar30._4_4_;
            if (iVar32 <= iVar29 && (iVar32 != iVar29 || auVar30._0_4_ <= auVar28._0_4_)) {
              pjVar19[2].flags = 0;
              pjVar19[3].flags = 0;
            }
            uVar24 = uVar24 + 4;
            pjVar19 = pjVar19 + 4;
          } while ((iVar21 + 3U & 0xfffffffc) != uVar24);
        }
        goto LAB_0011c07c;
      }
      jas_free(ptr);
    }
    pjVar1->cp = (jpc_dec_cp_t *)0x0;
  }
  else {
    if (bVar2 - 1 == (uint)(ms->parms).sot.numparts) {
      pjVar1->state = 2;
    }
LAB_0011c07c:
    dec->state = 0x10;
    iVar21 = 0;
  }
  return iVar21;
}

Assistant:

static int jpc_dec_process_sot(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_dec_tile_t *tile;
	jpc_sot_t *sot = &ms->parms.sot;
	jas_image_cmptparm_t *compinfos;
	jas_image_cmptparm_t *compinfo;
	jpc_dec_cmpt_t *cmpt;
	int cmptno;

	if (dec->state == JPC_MH) {

		if (!(compinfos = jas_alloc2(dec->numcomps,
		  sizeof(jas_image_cmptparm_t)))) {
			return -1;
		}
		for (cmptno = 0, cmpt = dec->cmpts, compinfo = compinfos;
		  cmptno < dec->numcomps; ++cmptno, ++cmpt, ++compinfo) {
			compinfo->tlx = 0;
			compinfo->tly = 0;
			compinfo->prec = cmpt->prec;
			compinfo->sgnd = cmpt->sgnd;
			compinfo->width = cmpt->width;
			compinfo->height = cmpt->height;
			compinfo->hstep = cmpt->hstep;
			compinfo->vstep = cmpt->vstep;
		}

		if (!(dec->image = jas_image_create(dec->numcomps, compinfos,
		  JAS_CLRSPC_UNKNOWN))) {
			jas_free(compinfos);
			return -1;
		}
		jas_free(compinfos);

		/* Is the packet header information stored in PPM marker segments in
		  the main header? */
		if (dec->ppmstab) {
			/* Convert the PPM marker segment data into a collection of streams
			  (one stream per tile-part). */
			if (!(dec->pkthdrstreams = jpc_ppmstabtostreams(dec->ppmstab))) {
				return -1;
			}
			jpc_ppxstab_destroy(dec->ppmstab);
			dec->ppmstab = 0;
		}
	}

	if (sot->len > 0) {
		dec->curtileendoff = jas_stream_getrwcount(dec->in) - ms->len -
		  4 + sot->len;
	} else {
		dec->curtileendoff = 0;
	}

	if (JAS_CAST(int, sot->tileno) >= dec->numtiles) {
		jas_eprintf("invalid tile number in SOT marker segment\n");
		return -1;
	}
	/* Set the current tile. */
	dec->curtile = &dec->tiles[sot->tileno];
	tile = dec->curtile;
	/* Ensure that this is the expected part number. */
	if (sot->partno != tile->partno) {
		return -1;
	}
	if (tile->numparts > 0 && sot->partno >= tile->numparts) {
		return -1;
	}
	if (!tile->numparts && sot->numparts > 0) {
		tile->numparts = sot->numparts;
	}

	tile->pptstab = 0;

	switch (tile->state) {
	case JPC_TILE_INIT:
		/* This is the first tile-part for this tile. */
		tile->state = JPC_TILE_ACTIVE;
		assert(!tile->cp);
		if (!(tile->cp = jpc_dec_cp_copy(dec->cp))) {
			return -1;
		}
		jpc_dec_cp_resetflags(dec->cp);
		break;
	default:
		if (sot->numparts == sot->partno - 1) {
			tile->state = JPC_TILE_ACTIVELAST;
		}
		break;
	}

	/* Note: We do not increment the expected tile-part number until
	  all processing for this tile-part is complete. */

	/* We should expect to encounter other tile-part header marker
	  segments next. */
	dec->state = JPC_TPH;

	return 0;
}